

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_output.cpp
# Opt level: O0

void stringify_token(Token *tok)

{
  int *in_RDI;
  char *quote;
  char *ptr;
  string *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *local_18;
  char *local_10;
  
  local_10 = tokstr;
  local_18 = "";
  if (*in_RDI == 4) {
    snprintf(tokstr,0x40,"%llu",*(undefined8 *)(in_RDI + 4));
  }
  else if (*in_RDI == 5) {
    snprintf(tokstr,0x40,"%g",*(undefined8 *)(in_RDI + 4));
  }
  else {
    if (*in_RDI == 3) {
      escapeJSON((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      local_10 = (char *)std::__cxx11::string::c_str();
    }
    else {
      local_10 = *(char **)(in_RDI + 4);
    }
    local_18 = "\"";
  }
  snprintf(buf,0x3ffff,"\"tt\":\"%s\",\"val\":%s%s%s,\"line\":%d,\"col\":%d",
           token_type_names[*in_RDI],local_18,local_10,local_18,in_RDI[2],
           (uint)*(ushort *)((long)in_RDI + 6));
  return;
}

Assistant:

static void stringify_token(Token & tok)
{
  const char * ptr = tokstr;
  const char * quote = "";
  if (tok.type == TK_INTEGER)
    snprintf(tokstr, 64, "%llu", (long long unsigned int)tok.u.i);
  else if (tok.type == TK_FLOAT)
    snprintf(tokstr, 64, "%g", tok.u.d);
  else if (tok.type == TK_STRING_LITERAL)
  {
    escapeJSON(tok.u.s, escapedStr);
    ptr = escapedStr.c_str();
    quote = "\"";
  }
  else
  {
    ptr = tok.u.s;
    quote = "\"";
  }

  snprintf(buf, sizeof(buf) - 1, "\"tt\":\"%s\",\"val\":%s%s%s,\"line\":%d,\"col\":%d",
    token_type_names[int(tok.type)], quote, ptr, quote, tok.line, tok.column);
}